

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O1

int faup_snapshot_append_item(faup_snapshot_t *snapshot,char *item_name,faup_snapshot_item_t *item)

{
  size_t sVar1;
  faup_snapshot_item_t **ppfVar2;
  faup_snapshot_item_t *pfVar3;
  long lVar4;
  htable *phVar5;
  htable *phVar6;
  byte bVar7;
  
  bVar7 = 0;
  if (snapshot == (faup_snapshot_t *)0x0) {
    faup_snapshot_append_item_cold_2();
  }
  else {
    ppfVar2 = (faup_snapshot_item_t **)realloc(snapshot->items,snapshot->length * 8 + 8);
    snapshot->items = ppfVar2;
    if (ppfVar2 != (faup_snapshot_item_t **)0x0) {
      pfVar3 = faup_snapshot_item_new(item->key);
      phVar5 = &item->values;
      phVar6 = &pfVar3->values;
      for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
        phVar6->rehash = phVar5->rehash;
        phVar5 = (htable *)((long)phVar5 + (ulong)bVar7 * -0x10 + 8);
        phVar6 = (htable *)((long)phVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      pfVar3->length = item->length;
      sVar1 = snapshot->length;
      snapshot->items[sVar1] = pfVar3;
      snapshot->length = sVar1 + 1;
      return 0;
    }
    faup_snapshot_append_item_cold_1();
  }
  return -1;
}

Assistant:

int faup_snapshot_append_item(faup_snapshot_t *snapshot, char *item_name, faup_snapshot_item_t *item)
{
  if (!snapshot) {
    fprintf(stderr, "Cannot append item to an unexisting snapshot!\n");
    return -1;
  }
  
  snapshot->items = realloc(snapshot->items, sizeof(faup_snapshot_item_t *) * (snapshot->length + 1));
  if (!snapshot->items) {
    fprintf(stderr, "Cannot allocatate a snapshot_item!\n");
    return -1;
  }

  snapshot->items[snapshot->length] = faup_snapshot_item_copy(item);
  
  snapshot->length++;
  
  return 0;
  
}